

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O0

void __thiscall SAT::topLevelCleanUp(SAT *this)

{
  uint uVar1;
  uint uVar2;
  vec<Clause_*> *pvVar3;
  Clause **ppCVar4;
  vec<Lit> *pvVar5;
  ostream *poVar6;
  Lit *pLVar7;
  char *pcVar8;
  int *piVar9;
  long in_RDI;
  uint i_1;
  int i;
  int in_stack_000001bc;
  vec<char> *in_stack_ffffffffffffff78;
  undefined1 dealloc;
  vec<Lit> *in_stack_ffffffffffffff80;
  SAT *in_stack_ffffffffffffff90;
  string *psVar10;
  string local_30 [32];
  uint local_10;
  uint local_c;
  
  pvVar3 = vec<vec<Clause_*>_>::operator[]((vec<vec<Clause_*>_> *)(in_RDI + 0xe0),0);
  local_c = vec<Clause_*>::size(pvVar3);
  while (0 < (int)local_c) {
    local_c = local_c - 1;
    pvVar3 = vec<vec<Clause_*>_>::operator[]((vec<vec<Clause_*>_> *)(in_RDI + 0xe0),0);
    ppCVar4 = vec<Clause_*>::operator[](pvVar3,local_c);
    free(*ppCVar4);
  }
  local_c = local_c - 1;
  vec<vec<Clause_*>_>::operator[]((vec<vec<Clause_*>_> *)(in_RDI + 0xe0),0);
  vec<Clause_*>::clear
            ((vec<Clause_*> *)in_stack_ffffffffffffff80,
             SUB81((ulong)in_stack_ffffffffffffff78 >> 0x38,0));
  if (((so.sat_simplify & 1U) != 0) && (*(long *)(in_RDI + 0x218) <= *(long *)(in_RDI + 0x200))) {
    simplifyDB(in_stack_ffffffffffffff90);
  }
  local_10 = 0;
  while( true ) {
    uVar2 = local_10;
    dealloc = (undefined1)((ulong)in_stack_ffffffffffffff78 >> 0x38);
    pvVar5 = vec<vec<Lit>_>::operator[]((vec<vec<Lit>_> *)(in_RDI + 0xc0),0);
    uVar1 = vec<Lit>::size(pvVar5);
    if (uVar1 <= uVar2) break;
    if ((so.debug & 1U) != 0) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"setting true at top-level: ");
      pvVar5 = vec<vec<Lit>_>::operator[]((vec<vec<Lit>_> *)(in_RDI + 0xc0),0);
      pLVar7 = vec<Lit>::operator[](pvVar5,local_10);
      toInt((Lit)pLVar7->x);
      psVar10 = local_30;
      getLitString_abi_cxx11_(in_stack_000001bc);
      poVar6 = std::operator<<(poVar6,psVar10);
      std::operator<<(poVar6,"\n");
      std::__cxx11::string::~string(local_30);
    }
    in_stack_ffffffffffffff78 = (vec<char> *)(in_RDI + 0x120);
    pvVar5 = vec<vec<Lit>_>::operator[]((vec<vec<Lit>_> *)(in_RDI + 0xc0),0);
    pLVar7 = vec<Lit>::operator[](pvVar5,local_10);
    uVar2 = ::var((Lit)pLVar7->x);
    pcVar8 = vec<char>::operator[](in_stack_ffffffffffffff78,uVar2);
    *pcVar8 = '\x01';
    in_stack_ffffffffffffff80 = (vec<Lit> *)(in_RDI + 0x70);
    pvVar5 = vec<vec<Lit>_>::operator[]((vec<vec<Lit>_> *)(in_RDI + 0xc0),0);
    pLVar7 = vec<Lit>::operator[](pvVar5,local_10);
    uVar2 = ::var((Lit)pLVar7->x);
    piVar9 = vec<int>::operator[]((vec<int> *)in_stack_ffffffffffffff80,uVar2);
    *piVar9 = -1;
    local_10 = local_10 + 1;
  }
  vec<vec<Lit>_>::operator[]((vec<vec<Lit>_> *)(in_RDI + 0xc0),0);
  vec<Lit>::clear(in_stack_ffffffffffffff80,(bool)dealloc);
  piVar9 = vec<int>::operator[]((vec<int> *)(in_RDI + 0xd0),0);
  *piVar9 = 0;
  return;
}

Assistant:

void SAT::topLevelCleanUp() {
	assert(decisionLevel() == 0);

	for (int i = rtrail[0].size(); i-- > 0;) {
		free(rtrail[0][i]);
	}
	rtrail[0].clear();

	if (so.sat_simplify && propagations >= next_simp_db) {
		simplifyDB();
	}

	for (unsigned int i = 0; i < trail[0].size(); i++) {
		if (so.debug) {
			std::cerr << "setting true at top-level: " << getLitString(toInt(trail[0][i])) << "\n";
		}
		seen[var(trail[0][i])] = 1;
		trailpos[var(trail[0][i])] = -1;
	}
	trail[0].clear();
	qhead[0] = 0;
}